

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

EColorRange V_FindFontColor(FName *name)

{
  int iVar1;
  int iVar2;
  EColorRange in_EAX;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  iVar3 = TranslationLookup.Count - 1;
  iVar5 = 0;
  do {
    if (iVar3 < iVar5) {
      return CR_UNTRANSLATED;
    }
    uVar4 = (uint)(iVar5 + iVar3) >> 1;
    iVar1 = TranslationLookup.Array[uVar4].Name.Index;
    iVar2 = name->Index;
    if (iVar1 == iVar2) {
      in_EAX = TranslationLookup.Array[uVar4].Number;
    }
    else if (iVar1 < iVar2) {
      iVar5 = uVar4 + 1;
    }
    else {
      iVar3 = uVar4 - 1;
    }
  } while (iVar1 != iVar2);
  return in_EAX;
}

Assistant:

unsigned int Size () const
	{
		return Count;
	}